

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

string * __thiscall
LiteScript::_Type_CLASS::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_CLASS *this,Variable *object)

{
  Class *this_00;
  uint uVar1;
  Object *pOVar2;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *pvVar3;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  uint uVar7;
  long lVar8;
  uint i;
  ulong uVar9;
  stringstream ss;
  undefined1 local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"{");
  pOVar2 = Variable::operator->(object);
  this_00 = (Class *)pOVar2->data;
  pvVar3 = Class::GetInherits(this_00);
  if ((pvVar3->super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (pvVar3->super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    std::operator<<(local_1a8,"inherits:[");
    uVar4 = (ulong)((long)(pvVar3->
                          super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar3->
                         super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 4;
    lVar8 = 0;
    for (uVar9 = 0; (uVar4 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
      Variable::operator->
                ((Variable *)
                 ((long)&((pvVar3->
                          super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                          )._M_impl.super__Vector_impl_data._M_start)->obj + lVar8));
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      if (uVar9 < (int)uVar4 - 1) {
        std::operator<<(local_1a8,",");
      }
      lVar8 = lVar8 + 0x10;
    }
    std::operator<<(local_1a8,"]");
    uVar1 = Class::GetStaticCount(this_00);
    if (uVar1 == 0) {
      uVar1 = Class::GetUnstaticCount(this_00);
      if (uVar1 == 0) goto LAB_001274b8;
    }
    std::operator<<(local_1a8,",");
  }
LAB_001274b8:
  uVar1 = Class::GetStaticCount(this_00);
  if (uVar1 != 0) {
    std::operator<<(local_1a8,"static:{");
    uVar1 = Class::GetStaticCount(this_00);
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      pcVar5 = Class::GetStaticName(this_00,uVar7);
      poVar6 = std::operator<<(local_1a8,pcVar5);
      poVar6 = std::operator<<(poVar6,":");
      Class::GetStaticMember((Class *)local_1e8,(uint)this_00);
      Variable::operator_cast_to_string((string *)(local_1e8 + 0x10),(Variable *)local_1e8);
      std::operator<<(poVar6,(char *)local_1e8._16_8_);
      std::__cxx11::string::~string((string *)(local_1e8 + 0x10));
      Variable::~Variable((Variable *)local_1e8);
      if (uVar7 < uVar1 - 1) {
        std::operator<<(local_1a8,",");
      }
    }
    std::operator<<(local_1a8,"}");
    uVar1 = Class::GetUnstaticCount(this_00);
    if (uVar1 != 0) {
      std::operator<<(local_1a8,",");
    }
  }
  uVar1 = Class::GetUnstaticCount(this_00);
  if (uVar1 != 0) {
    std::operator<<(local_1a8,"unstatic:{");
    uVar1 = Class::GetConstructorIndex(this_00);
    uVar7 = Class::GetUnstaticCount(this_00);
    for (i = 0; uVar7 != i; i = i + 1) {
      pcVar5 = Class::GetUnstaticName(this_00,i);
      poVar6 = std::operator<<(local_1a8,pcVar5);
      pcVar5 = "";
      if (uVar1 == i) {
        pcVar5 = "(constructor)";
      }
      poVar6 = std::operator<<(poVar6,pcVar5);
      poVar6 = std::operator<<(poVar6,":");
      Class::GetUnstaticMember((Class *)local_1e8,(uint)this_00);
      Variable::operator_cast_to_string((string *)(local_1e8 + 0x10),(Variable *)local_1e8);
      std::operator<<(poVar6,(char *)local_1e8._16_8_);
      std::__cxx11::string::~string((string *)(local_1e8 + 0x10));
      Variable::~Variable((Variable *)local_1e8);
      if (i < uVar7 - 1) {
        std::operator<<(local_1a8,",");
      }
    }
    std::operator<<(local_1a8,"}");
  }
  std::operator<<(local_1a8,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_CLASS::ToString(const Variable &object) const {
    std::stringstream ss;
    ss << "{";
    const Class& C = object->GetData<Class>();
    const std::vector<LiteScript::Variable>& inherits = C.GetInherits();
    if (inherits.size() > 0) {
        ss << "inherits:[";
        for (unsigned int i = 0, sz = inherits.size(); i < sz; i++) {
            ss << inherits[i]->ID;
            if (i < sz - 1)
                ss << ",";
        }
        ss << "]";
        if (C.GetStaticCount() > 0 || C.GetUnstaticCount() > 0)
            ss << ",";
    }
    if (C.GetStaticCount() > 0) {
        ss << "static:{";
        for (unsigned int i = 0, sz = C.GetStaticCount(); i < sz; i++) {
            ss << C.GetStaticName(i) << ":" << ((std::string)C.GetStaticMember(i)).c_str();
            if (i < sz - 1)
                ss << ",";
        }
        ss << "}";
        if (C.GetUnstaticCount() > 0)
            ss << ",";
    }
    if (C.GetUnstaticCount() > 0) {
        ss << "unstatic:{";
        int construct = C.GetConstructorIndex();
        for (unsigned int i = 0, sz = C.GetUnstaticCount(); i < sz; i++) {
            ss << C.GetUnstaticName(i) << ((int)i == construct ? "(constructor)" : "") << ":" << ((std::string)C.GetUnstaticMember(i)).c_str();
            if (i < sz - 1)
                ss << ",";
        }
        ss << "}";
    }
    ss << "}";
    return ss.str();
}